

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::save_load_memory_tree(memory_tree *b,io_buf *model_file,bool read,bool text)

{
  uint32_t uVar1;
  size_t sVar2;
  ostream *poVar3;
  node *cn;
  int *len;
  ostream *this;
  stringstream *msg_00;
  byte in_CL;
  uint uVar4;
  uint uVar5;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  uint32_t i_3;
  example *new_ec;
  uint32_t i_2;
  size_t n_examples;
  uint32_t i_1;
  uint32_t i;
  size_t n_nodes;
  size_t ss_1;
  size_t ss;
  stringstream msg;
  undefined4 in_stack_fffffffffffffcb8;
  uint32_t in_stack_fffffffffffffcbc;
  parameters *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  stringstream *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  undefined1 uVar6;
  undefined1 read_00;
  node *in_stack_fffffffffffffce0;
  bool *in_stack_fffffffffffffce8;
  node *in_stack_fffffffffffffcf0;
  io_buf *in_stack_fffffffffffffcf8;
  uint local_23c;
  uint local_22c;
  int *oas;
  undefined4 in_stack_fffffffffffffde0;
  bool *in_stack_fffffffffffffde8;
  bool *in_stack_fffffffffffffdf0;
  io_buf *in_stack_fffffffffffffdf8;
  example *in_stack_fffffffffffffe00;
  uint local_1cc;
  stringstream local_1a0 [16];
  ostream local_190;
  byte local_12;
  byte local_11;
  long local_10;
  long local_8;
  
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffcd8 >> 0x38);
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  sVar2 = v_array<int>::size((v_array<int> *)(local_10 + 0x30));
  if (sVar2 != 0) {
    if ((local_11 & 1) != 0) {
      *(undefined1 *)(local_8 + 0xb0) = 1;
    }
    if ((local_11 & 1) == 0) {
      uVar1 = parameters::stride_shift
                        ((parameters *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                        );
      poVar3 = std::operator<<(&local_190,"stride_shift");
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)uVar1);
      std::operator<<(poVar3," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                 (size_t)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,(bool)uVar6,
                 in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
    }
    else {
      poVar3 = std::operator<<(&local_190,"stride_shift");
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
      std::operator<<(poVar3," ");
      bin_text_read_write_fixed
                (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
                 (size_t)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,(bool)uVar6,
                 in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
      parameters::stride_shift(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    }
    poVar3 = std::operator<<(&local_190,"max_nodes");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(local_8 + 0x50));
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
               (size_t)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,(bool)uVar6,
               in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
    poVar3 = std::operator<<(&local_190,"learn_at_leaf");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(local_8 + 0xac));
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
               (size_t)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,(bool)uVar6,
               in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
    poVar3 = std::operator<<(&local_190,"oas");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(local_8 + 0xcc));
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
               (size_t)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,(bool)uVar6,
               in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
    sVar2 = v_array<memory_tree_ns::node>::size((v_array<memory_tree_ns::node> *)(local_8 + 8));
    poVar3 = std::operator<<(&local_190,"nodes");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
               (size_t)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,(bool)uVar6,
               in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
    poVar3 = std::operator<<(&local_190,"max_number_of_labels");
    poVar3 = std::operator<<(poVar3," = ");
    cn = (node *)std::ostream::operator<<(poVar3,*(ulong *)(local_8 + 0x68));
    std::operator<<((ostream *)cn," ");
    uVar4 = local_12 & 1;
    bin_text_read_write_fixed
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
               (size_t)in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,(bool)uVar6,
               in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
    if ((local_11 & 1) != 0) {
      v_array<memory_tree_ns::node>::clear
                ((v_array<memory_tree_ns::node> *)in_stack_fffffffffffffcc0);
      for (local_1cc = 0; local_1cc < sVar2; local_1cc = local_1cc + 1) {
        in_stack_fffffffffffffcf8 = (io_buf *)(local_8 + 8);
        node::node(in_stack_fffffffffffffce0);
        v_array<memory_tree_ns::node>::push_back
                  ((v_array<memory_tree_ns::node> *)in_stack_fffffffffffffcc0,
                   (node *)CONCAT44(in_stack_fffffffffffffcbc,uVar4));
      }
    }
    for (uVar4 = 0; uVar6 = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38), uVar4 < sVar2;
        uVar4 = uVar4 + 1) {
      in_stack_fffffffffffffcf0 =
           v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar4);
      save_load_node(cn,in_stack_fffffffffffffcf8,(bool *)in_stack_fffffffffffffcf0,
                     in_stack_fffffffffffffce8,(stringstream *)in_stack_fffffffffffffce0);
    }
    len = (int *)v_array<example_*>::size((v_array<example_*> *)(local_8 + 0x28));
    oas = len;
    poVar3 = std::operator<<(&local_190,"examples");
    this = std::operator<<(poVar3," = ");
    msg_00 = (stringstream *)std::ostream::operator<<(this,(ulong)oas);
    read_00 = (undefined1)((ulong)this >> 0x38);
    std::operator<<((ostream *)msg_00," ");
    uVar5 = local_12 & 1;
    bin_text_read_write_fixed
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,(size_t)len,
               (char *)poVar3,(bool)read_00,msg_00,(bool)uVar6);
    if ((local_11 & 1) != 0) {
      v_array<example_*>::clear((v_array<example_*> *)in_stack_fffffffffffffcc0);
      for (local_22c = 0; (int *)(ulong)local_22c < oas; local_22c = local_22c + 1) {
        calloc_or_throw<example>();
        v_array<example_*>::push_back
                  ((v_array<example_*> *)in_stack_fffffffffffffcc0,
                   (example **)CONCAT44(in_stack_fffffffffffffcbc,uVar5));
      }
    }
    for (local_23c = 0; (int *)(ulong)local_23c < oas; local_23c = local_23c + 1) {
      v_array<example_*>::operator[]((v_array<example_*> *)(local_8 + 0x28),(ulong)local_23c);
      save_load_example(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        (stringstream *)CONCAT44(uVar4,in_stack_fffffffffffffde0),oas);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void save_load_memory_tree(memory_tree& b, io_buf& model_file, bool read, bool text)
    {
        stringstream msg;
        if (model_file.files.size() > 0){
            if (read)
                b.test_mode = true;

            if (read)
            {
                size_t ss = 0;
                writeit(ss, "stride_shift");
                b.all->weights.stride_shift(ss);
            }
            else
            {
                size_t ss = b.all->weights.stride_shift();
                writeit(ss, "stride_shift");
            }
            
            writeit(b.max_nodes, "max_nodes");
            writeit(b.learn_at_leaf, "learn_at_leaf");
            writeit(b.oas, "oas");
	        //writeit(b.leaf_example_multiplier, "leaf_example_multiplier")
            writeitvar(b.nodes.size(), "nodes", n_nodes); 
            writeit(b.max_num_labels, "max_number_of_labels");

            if (read){
                b.nodes.clear();
                for (uint32_t i = 0; i < n_nodes; i++)
                    b.nodes.push_back(node());
            }
            
            //node  
            for(uint32_t i = 0; i < n_nodes; i++){
                save_load_node(b.nodes[i], model_file, read, text, msg);
            }
            //deal with examples:
            writeitvar(b.examples.size(), "examples", n_examples);
            if (read){
                b.examples.clear();
                for (uint32_t i = 0; i < n_examples; i++){
                    example* new_ec = &calloc_or_throw<example>();
                    b.examples.push_back(new_ec);
                }
            }
            for (uint32_t i = 0; i < n_examples; i++)
                save_load_example(b.examples[i], model_file, read, text, msg, b.oas);
	    //cout<<"done loading...."<<endl;
            
            
        }
    }